

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = field_number << 3;
  pbVar3 = output->cur_;
  if ((output->impl_).end_ <= pbVar3) {
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar3);
  }
  output->cur_ = pbVar3;
  bVar5 = (byte)uVar8;
  if (uVar8 < 0x80) {
    *pbVar3 = bVar5 | 3;
    pbVar3 = pbVar3 + 1;
  }
  else {
    *pbVar3 = bVar5 | 0x83;
    if (uVar8 < 0x4000) {
      pbVar3[1] = (byte)(uVar8 >> 7);
      pbVar3 = pbVar3 + 2;
    }
    else {
      pbVar3 = pbVar3 + 2;
      uVar7 = uVar8 >> 7;
      do {
        pbVar4 = pbVar3;
        pbVar4[-1] = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar3 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar1);
      *pbVar4 = (byte)uVar6;
    }
  }
  output->cur_ = pbVar3;
  (*value->_vptr_MessageLite[10])(value);
  iVar2 = (*value->_vptr_MessageLite[0xc])(value,output->cur_,output);
  pbVar3 = (byte *)CONCAT44(extraout_var,iVar2);
  output->cur_ = pbVar3;
  if ((output->impl_).end_ <= pbVar3) {
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar3);
  }
  output->cur_ = pbVar3;
  if (uVar8 < 0x80) {
    *pbVar3 = bVar5 | 4;
    pbVar3 = pbVar3 + 1;
  }
  else {
    *pbVar3 = bVar5 | 0x84;
    if (uVar8 < 0x4000) {
      pbVar3[1] = (byte)(uVar8 >> 7);
      pbVar3 = pbVar3 + 2;
    }
    else {
      pbVar3 = pbVar3 + 2;
      uVar8 = uVar8 >> 7;
      do {
        pbVar4 = pbVar3;
        pbVar4[-1] = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar3 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar1);
      *pbVar4 = (byte)uVar7;
    }
  }
  output->cur_ = pbVar3;
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  WriteSubMessageMaybeToArray(size, value, output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}